

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O0

int __thiscall SingleFileMuxer::close(SingleFileMuxer *this,int __fd)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined7 extraout_var;
  reference __in;
  type *ppSVar4;
  char *pcVar5;
  ulong uVar6;
  char *__new;
  ostream *poVar7;
  VodCoreException *this_00;
  size_t __n;
  _Self *__y;
  undefined8 uVar8;
  string local_218;
  ostringstream local_1f8 [8];
  ostringstream ss;
  undefined1 local_70 [8];
  string newName;
  StreamInfo *streamInfo;
  type *snd;
  type *fst;
  _Self local_30;
  iterator __end1;
  iterator __begin1;
  map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
  *__range1;
  SingleFileMuxer *this_local;
  
  __end1 = std::
           map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
           ::begin(&this->m_streamInfo);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
       ::end(&this->m_streamInfo);
  do {
    __y = &local_30;
    bVar1 = std::operator!=(&__end1,__y);
    iVar3 = (int)__y;
    uVar6 = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      this_local._7_1_ = 1;
LAB_00334470:
      return (int)CONCAT71((int7)(uVar6 >> 8),this_local._7_1_);
    }
    __in = std::_Rb_tree_iterator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>::operator*
                     (&__end1);
    std::get<0ul,int_const,SingleFileMuxer::StreamInfo*>(__in);
    ppSVar4 = std::get<1ul,int_const,SingleFileMuxer::StreamInfo*>(__in);
    newName.field_2._8_8_ = *ppSVar4;
    uVar2 = File::close((File *)newName.field_2._8_8_,iVar3);
    uVar8 = newName.field_2._8_8_;
    uVar6 = (ulong)uVar2;
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
      goto LAB_00334470;
    }
    if (0 < *(int *)(newName.field_2._8_8_ + 0x74)) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      __n = 0;
      uVar2 = File::open((File *)uVar8,pcVar5,6);
      uVar6 = (ulong)uVar2;
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_00334470;
      }
      iVar3 = (int)*(undefined8 *)(newName.field_2._8_8_ + 0x68);
      uVar6 = File::write((File *)newName.field_2._8_8_,iVar3,
                          (void *)(ulong)*(uint *)(newName.field_2._8_8_ + 0x74),__n);
      if ((int)uVar6 == 0) {
        this_local._7_1_ = 0;
        goto LAB_00334470;
      }
      if (*(long *)(newName.field_2._8_8_ + 0x80) != 0) {
        uVar8 = newName.field_2._8_8_;
        uVar6 = (**(code **)(**(long **)(newName.field_2._8_8_ + 0x80) + 0x70))();
        iVar3 = (int)uVar8;
        if ((uVar6 & 1) == 0) {
          this_local._7_1_ = 0;
          goto LAB_00334470;
        }
      }
      uVar2 = File::close((File *)newName.field_2._8_8_,iVar3);
      uVar6 = (ulong)uVar2;
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_00334470;
      }
      if (1 < *(int *)(newName.field_2._8_8_ + 0x70)) {
        getNewName((string *)local_70,(string *)(newName.field_2._8_8_ + 0x38),
                   *(int *)(newName.field_2._8_8_ + 0x70));
        deleteFile((string *)local_70);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        __new = (char *)std::__cxx11::string::c_str();
        iVar3 = rename(pcVar5,__new);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream(local_1f8);
          poVar7 = std::operator<<((ostream *)local_1f8,"Can\'t rename file ");
          poVar7 = std::operator<<(poVar7,(string *)(newName.field_2._8_8_ + 0x38));
          poVar7 = std::operator<<(poVar7," to ");
          std::operator<<(poVar7,(string *)local_70);
          this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(this_00,3,&local_218);
          __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        std::__cxx11::string::~string((string *)local_70);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

bool SingleFileMuxer::close()
{
    for (const auto& [fst, snd] : m_streamInfo)
    {
        StreamInfo* streamInfo = snd;
        if (!streamInfo->m_file.close())
            return false;
        if (streamInfo->m_bufLen > 0)
        {
            if (!streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofAppend))
                return false;
            if (!streamInfo->m_file.write(streamInfo->m_buffer, streamInfo->m_bufLen))
                return false;
            if (streamInfo->m_codecReader)
                if (!streamInfo->m_codecReader->beforeFileCloseEvent(streamInfo->m_file))
                    return false;
            if (!streamInfo->m_file.close())
                return false;

            if (streamInfo->m_part > 1)
            {
                std::string newName = getNewName(streamInfo->m_fileName, streamInfo->m_part);
                deleteFile(newName);
                if (rename(streamInfo->m_fileName.c_str(), newName.c_str()) != 0)
                    THROW(ERR_COMMON, "Can't rename file " << streamInfo->m_fileName << " to " << newName)
            }
        }
    }
    return true;
}